

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O2

int lua_sj_get_label(char *name)

{
  bool bVar1;
  int to_remove;
  aint val;
  char *n;
  
  if (name != (char *)0x0) {
    to_remove = addLuaSourcePositions();
    n = name;
    bVar1 = GetLabelValue(&n,&val);
    if (!bVar1) {
      val = -1;
    }
    removeLuaSourcePositions(to_remove);
    return val;
  }
  return -1;
}

Assistant:

static int lua_sj_get_label(const char *name) {
	if (nullptr == name) return -1;
	aint val;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	char* n = const_cast<char*>(name);	//TODO try to get rid of const_cast, LuaBridge requires const char* to understand it as lua string
	if (!GetLabelValue(n, val)) val = -1;
	removeLuaSourcePositions(positionsAdded);
	return val;
}